

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O0

void DepParserTask::extract_features(search *sch,uint32_t idx,multi_ex *ec)

{
  bool bVar1;
  uint uVar2;
  task_data *ptVar3;
  v_array<unsigned_int> *this;
  v_array<unsigned_int> *this_00;
  v_array<unsigned_int> *this_01;
  size_type sVar4;
  v_array<unsigned_int> *this_02;
  size_t sVar5;
  uint **ppuVar6;
  reference ppeVar7;
  uint *puVar8;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  uint in_ESI;
  search *in_RDI;
  iterator iVar9;
  float new_weight;
  size_t new_count;
  features fs;
  iterator __end1;
  iterator __begin1;
  example *__range1;
  size_t count;
  size_t j;
  uint64_t additional_offset;
  size_t i_7;
  size_t i_6;
  uint64_t additional_offset_1;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  size_t last;
  bool empty;
  size_t n;
  example *ex;
  example **ec_buf;
  v_array<unsigned_int> *temp;
  v_array<unsigned_int> *children;
  v_array<unsigned_int> *tags;
  v_array<unsigned_int> *stack;
  uint64_t multiplier;
  uint64_t mask;
  task_data *data;
  vw *all;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  example_predict *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda4;
  uint64_t in_stack_fffffffffffffda8;
  example *idx_00;
  undefined4 in_stack_fffffffffffffdb0;
  uint in_stack_fffffffffffffdb4;
  uint local_240;
  uint local_230;
  undefined4 in_stack_fffffffffffffdd4;
  uint64_t in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  uint64_t in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf4;
  example *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  uint local_1f8;
  uint local_1f0;
  example *local_1d8;
  example *local_1c0;
  example *local_1b0;
  example *local_1a0;
  uint local_194;
  float local_184;
  long local_180;
  iterator local_108;
  example *peVar10;
  vw *all_00;
  ulong local_d8;
  ulong local_c8;
  ulong local_c0;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong length;
  
  Search::search::get_vw_pointer_unsafe(in_RDI);
  ptVar3 = Search::search::get_task_data<task_data>(in_RDI);
  reset_ex((example *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  Search::search::get_mask((search *)0x3d72b5);
  parameters::stride_shift
            ((parameters *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  this = &ptVar3->stack;
  this_00 = ptVar3->children;
  this_01 = &ptVar3->temp;
  peVar10 = ptVar3->ex;
  sVar4 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX);
  bVar1 = v_array<unsigned_int>::empty(this);
  if (bVar1) {
    local_194 = 0;
    local_240 = in_stack_fffffffffffffdb4;
  }
  else {
    local_194 = v_array<unsigned_int>::last(this);
    local_240 = in_stack_fffffffffffffdb4;
  }
  this_02 = (v_array<unsigned_int> *)(ulong)local_194;
  for (length = 0; length < 0xd; length = length + 1) {
    ptVar3->ec_buf[length] = (example *)0x0;
  }
  for (local_90 = 0; local_90 < 3; local_90 = local_90 + 1) {
    sVar5 = v_array<unsigned_int>::size(this);
    if ((local_90 < sVar5) &&
       (ppuVar6 = v_array<unsigned_int>::end(this), (*ppuVar6)[-(local_90 + 1)] != 0)) {
      ppuVar6 = v_array<unsigned_int>::end(this);
      ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                          (in_RDX,(ulong)((*ppuVar6)[-(local_90 + 1)] - 1));
      local_1a0 = *ppeVar7;
    }
    else {
      local_1a0 = (example *)0x0;
    }
    ptVar3->ec_buf[local_90] = local_1a0;
  }
  for (local_98 = 3; local_98 < 6; local_98 = local_98 + 1) {
    if ((in_ESI + local_98) - 4 < sVar4) {
      ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                          (in_RDX,(in_ESI + local_98) - 4);
      local_1b0 = *ppeVar7;
    }
    else {
      local_1b0 = (example *)0x0;
    }
    ptVar3->ec_buf[local_98] = local_1b0;
  }
  for (local_a0 = 6; local_a0 < 10; local_a0 = local_a0 + 1) {
    if (((!bVar1) && (this_02 != (v_array<unsigned_int> *)0x0)) &&
       (puVar8 = v_array<unsigned_int>::operator[](this_00 + (local_a0 - 4),(size_t)this_02),
       *puVar8 != 0)) {
      puVar8 = v_array<unsigned_int>::operator[](this_00 + (local_a0 - 4),(size_t)this_02);
      ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                          (in_RDX,(ulong)(*puVar8 - 1));
      ptVar3->ec_buf[local_a0] = *ppeVar7;
    }
  }
  for (local_a8 = 10; local_a8 < 0xc; local_a8 = local_a8 + 1) {
    if ((sVar4 < in_ESI) ||
       (puVar8 = v_array<unsigned_int>::operator[](this_00 + (local_a8 - 8),(ulong)in_ESI),
       *puVar8 == 0)) {
      local_1c0 = (example *)0x0;
    }
    else {
      puVar8 = v_array<unsigned_int>::operator[](this_00 + (local_a8 - 8),(ulong)in_ESI);
      ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                          (in_RDX,(ulong)(*puVar8 - 1));
      local_1c0 = *ppeVar7;
    }
    ptVar3->ec_buf[local_a8] = local_1c0;
  }
  sVar5 = v_array<unsigned_int>::size(this);
  if ((1 < sVar5) && (ppuVar6 = v_array<unsigned_int>::end(this), (*ppuVar6)[-2] != 0)) {
    ppuVar6 = v_array<unsigned_int>::end(this);
    puVar8 = v_array<unsigned_int>::operator[](ptVar3->children + 2,(ulong)(*ppuVar6)[-2]);
    if (*puVar8 != 0) {
      ppuVar6 = v_array<unsigned_int>::end(this);
      puVar8 = v_array<unsigned_int>::operator[](ptVar3->children + 2,(ulong)(*ppuVar6)[-2]);
      ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                          (in_RDX,(ulong)(*puVar8 - 1));
      local_1d8 = *ppeVar7;
      goto LAB_003d788c;
    }
  }
  local_1d8 = (example *)0x0;
LAB_003d788c:
  ptVar3->ec_buf[0xc] = local_1d8;
  for (local_b0 = 0; local_b0 < 0xd; local_b0 = local_b0 + 1) {
    if (ptVar3->ec_buf[local_b0] == (example *)0x0) {
      add_feature((example *)CONCAT44(local_240,in_stack_fffffffffffffdb0),in_stack_fffffffffffffda8
                  ,(uchar)((uint)in_stack_fffffffffffffda4 >> 0x18),
                  CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                  (uint64_t)in_stack_fffffffffffffd90,
                  SUB41((uint)in_stack_fffffffffffffd8c >> 0x18,0));
    }
    else {
      add_all_features((example *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       in_stack_fffffffffffffdf8,(uchar)((uint)in_stack_fffffffffffffdf4 >> 0x18),
                       in_stack_fffffffffffffde8,
                       CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                       in_stack_fffffffffffffdd8,SUB41((uint)in_stack_fffffffffffffdd4 >> 0x18,0));
    }
  }
  v_array<unsigned_int>::resize(this_02,length);
  if (bVar1) {
    local_1f0 = 0;
  }
  else {
    if (sVar4 < in_ESI) {
      local_1f8 = 1;
    }
    else {
      sVar5 = min(5,(ulong)(in_ESI - (int)this_02));
      local_1f8 = (int)sVar5 + 2;
    }
    local_1f0 = local_1f8;
  }
  puVar8 = v_array<unsigned_int>::operator[](this_01,0);
  *puVar8 = local_1f0;
  if (bVar1) {
    uVar2 = 1;
  }
  else {
    puVar8 = v_array<unsigned_int>::operator[](this_00,(size_t)this_02);
    sVar5 = min(5,(ulong)*puVar8);
    uVar2 = (int)sVar5 + 1;
  }
  puVar8 = v_array<unsigned_int>::operator[](this_01,1);
  *puVar8 = uVar2;
  if (bVar1) {
    uVar2 = 1;
  }
  else {
    puVar8 = v_array<unsigned_int>::operator[](ptVar3->children + 1,(size_t)this_02);
    sVar5 = min(5,(ulong)*puVar8);
    uVar2 = (int)sVar5 + 1;
  }
  puVar8 = v_array<unsigned_int>::operator[](this_01,2);
  *puVar8 = uVar2;
  if (sVar4 < in_ESI) {
    uVar2 = 1;
  }
  else {
    puVar8 = v_array<unsigned_int>::operator[](this_00,(ulong)in_ESI);
    sVar5 = min(5,(ulong)*puVar8);
    uVar2 = (int)sVar5 + 1;
  }
  puVar8 = v_array<unsigned_int>::operator[](this_01,3);
  *puVar8 = uVar2;
  for (local_c0 = 4; local_c0 < 8; local_c0 = local_c0 + 1) {
    if ((bVar1) ||
       (puVar8 = v_array<unsigned_int>::operator[](this_00 + (local_c0 - 2),(size_t)this_02),
       *puVar8 == 0)) {
      local_230 = 0xf;
    }
    else {
      puVar8 = v_array<unsigned_int>::operator[](this_00 + (local_c0 - 2),(size_t)this_02);
      puVar8 = v_array<unsigned_int>::operator[](&ptVar3->tags,(ulong)*puVar8);
      local_230 = *puVar8;
    }
    puVar8 = v_array<unsigned_int>::operator[](this_01,local_c0);
    *puVar8 = local_230;
  }
  for (local_c8 = 8; local_c8 < 10; local_c8 = local_c8 + 1) {
    if ((sVar4 < in_ESI) ||
       (puVar8 = v_array<unsigned_int>::operator[](this_00 + (local_c8 - 6),(ulong)in_ESI),
       *puVar8 == 0)) {
      local_240 = 0xf;
    }
    else {
      puVar8 = v_array<unsigned_int>::operator[](this_00 + (local_c8 - 6),(ulong)in_ESI);
      puVar8 = v_array<unsigned_int>::operator[](&ptVar3->tags,(ulong)*puVar8);
      local_240 = *puVar8;
    }
    puVar8 = v_array<unsigned_int>::operator[](this_01,local_c8);
    *puVar8 = local_240;
  }
  for (local_d8 = 0; local_d8 < 10; local_d8 = local_d8 + 1) {
    idx_00 = peVar10;
    v_array<unsigned_int>::operator[](this_01,local_d8);
    add_feature((example *)CONCAT44(local_240,in_stack_fffffffffffffdb0),(uint64_t)idx_00,
                (uchar)((uint)in_stack_fffffffffffffda4 >> 0x18),
                CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                (uint64_t)in_stack_fffffffffffffd90,SUB41((uint)in_stack_fffffffffffffd8c >> 0x18,0)
               );
  }
  all_00 = (vw *)0x0;
  peVar10 = ptVar3->ex;
  iVar9 = example_predict::begin(in_stack_fffffffffffffd90);
  local_108 = example_predict::end(in_stack_fffffffffffffd90);
  while (bVar1 = example_predict::iterator::operator!=
                           ((iterator *)&stack0xffffffffffffff08,&local_108), bVar1) {
    example_predict::iterator::operator*((iterator *)&stack0xffffffffffffff08);
    features::size((features *)0x3d7ed8);
    sVar5 = features::size((features *)0x3d7f2d);
    all_00 = (vw *)((long)&all_00->sd + sVar5);
    example_predict::iterator::operator++((iterator *)&stack0xffffffffffffff08);
  }
  INTERACTIONS::eval_count_of_generated_ft
            (all_00,peVar10,(size_t *)iVar9._index,(float *)iVar9._feature_space);
  ptVar3->ex->num_features = (long)&all_00->sd + local_180;
  ptVar3->ex->total_sum_feat_sq = (float)all_00 + local_184;
  return;
}

Assistant:

void extract_features(Search::search &sch, uint32_t idx, multi_ex &ec)
{
  vw &all = sch.get_vw_pointer_unsafe();
  task_data *data = sch.get_task_data<task_data>();
  reset_ex(data->ex);
  uint64_t mask = sch.get_mask();
  uint64_t multiplier = (uint64_t)all.wpp << all.weights.stride_shift();

  v_array<uint32_t> &stack = data->stack, &tags = data->tags, *children = data->children, &temp = data->temp;
  example **ec_buf = data->ec_buf;
  example &ex = *(data->ex);

  size_t n = ec.size();
  bool empty = stack.empty();
  size_t last = empty ? 0 : stack.last();

  for (size_t i = 0; i < 13; i++) ec_buf[i] = nullptr;

  // feature based on the top three examples in stack ec_buf[0]: s1, ec_buf[1]: s2, ec_buf[2]: s3
  for (size_t i = 0; i < 3; i++)
    ec_buf[i] = (stack.size() > i && *(stack.end() - (i + 1)) != 0) ? ec[*(stack.end() - (i + 1)) - 1] : 0;

  // features based on examples in string buffer ec_buf[3]: b1, ec_buf[4]: b2, ec_buf[5]: b3
  for (size_t i = 3; i < 6; i++) ec_buf[i] = (idx + (i - 3) - 1 < n) ? ec[idx + i - 3 - 1] : 0;

  // features based on the leftmost and the rightmost children of the top element stack ec_buf[6]: sl1, ec_buf[7]: sl2,
  // ec_buf[8]: sr1, ec_buf[9]: sr2;
  for (size_t i = 6; i < 10; i++)
    if (!empty && last != 0 && children[i - 4][last] != 0)
      ec_buf[i] = ec[children[i - 4][last] - 1];

  // features based on leftmost children of the top element in bufer ec_buf[10]: bl1, ec_buf[11]: bl2
  for (size_t i = 10; i < 12; i++)
    ec_buf[i] = (idx <= n && children[i - 8][idx] != 0) ? ec[children[i - 8][idx] - 1] : 0;
  ec_buf[12] = (stack.size() > 1 && *(stack.end() - 2) != 0 && children[2][*(stack.end() - 2)] != 0)
      ? ec[children[2][*(stack.end() - 2)] - 1]
      : 0;

  // unigram features
  for (size_t i = 0; i < 13; i++)
  {
    uint64_t additional_offset = (uint64_t)(i * offset_const);
    if (!ec_buf[i])
      add_feature(ex, (uint64_t)438129041 + additional_offset, (unsigned char)((i + 1) + 'A'), mask, multiplier);
    else
      add_all_features(ex, *ec_buf[i], 'A' + (unsigned char)(i + 1), mask, multiplier, additional_offset, false);
  }

  // Other features
  temp.resize(10);
  temp[0] = empty ? 0 : (idx > n ? 1 : 2 + min(5, idx - (uint32_t)last));
  temp[1] = empty ? 1 : 1 + min(5, children[0][last]);
  temp[2] = empty ? 1 : 1 + min(5, children[1][last]);
  temp[3] = idx > n ? 1 : 1 + min(5, children[0][idx]);
  for (size_t i = 4; i < 8; i++) temp[i] = (!empty && children[i - 2][last] != 0) ? tags[children[i - 2][last]] : 15;
  for (size_t i = 8; i < 10; i++) temp[i] = (idx <= n && children[i - 6][idx] != 0) ? tags[children[i - 6][idx]] : 15;

  uint64_t additional_offset = val_namespace * offset_const;
  for (size_t j = 0; j < 10; j++)
  {
    additional_offset += j * 1023;
    add_feature(ex, temp[j] + additional_offset, val_namespace, mask, multiplier);
  }
  size_t count = 0;
  for (features fs : *data->ex)
  {
    fs.sum_feat_sq = (float)fs.size();
    count += fs.size();
  }

  size_t new_count;
  float new_weight;
  INTERACTIONS::eval_count_of_generated_ft(all, *data->ex, new_count, new_weight);

  data->ex->num_features = count + new_count;
  data->ex->total_sum_feat_sq = (float)count + new_weight;
}